

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Proxy_Function_Base::Proxy_Function_Base
          (Proxy_Function_Base *this,
          vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *t_types,int t_arity
          )

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  ulong local_28;
  size_t i;
  int t_arity_local;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *t_types_local;
  Proxy_Function_Base *this_local;
  
  this->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_0024f118;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&this->m_types,t_types);
  this->m_arity = t_arity;
  this->m_has_arithmetic_param = false;
  local_28 = 1;
  while( true ) {
    sVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                      (&this->m_types);
    if (sVar2 <= local_28) {
      return;
    }
    this_00 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::operator[]
                        (&this->m_types,local_28);
    bVar1 = Type_Info::is_arithmetic(this_00);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  this->m_has_arithmetic_param = true;
  return;
}

Assistant:

Proxy_Function_Base(std::vector<Type_Info> t_types, int t_arity)
          : m_types(std::move(t_types))
          , m_arity(t_arity)
          , m_has_arithmetic_param(false) {
        for (size_t i = 1; i < m_types.size(); ++i) {
          if (m_types[i].is_arithmetic()) {
            m_has_arithmetic_param = true;
            return;
          }
        }
      }